

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

unqlite_col_record * CollectionCacheFetchRecord(unqlite_col *pCol,jx9_int64 nId)

{
  unqlite_col_record *local_28;
  unqlite_col_record *pEntry;
  jx9_int64 nId_local;
  unqlite_col *pCol_local;
  
  if (pCol->nRec != 0) {
    for (local_28 = pCol->apRecord[nId & (ulong)(pCol->nRecSize - 1)];
        local_28 != (unqlite_col_record *)0x0; local_28 = local_28->pNextCol) {
      if (local_28->nId == nId) {
        return local_28;
      }
    }
  }
  return (unqlite_col_record *)0x0;
}

Assistant:

static unqlite_col_record * CollectionCacheFetchRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId      /* Unique record ID */
	)
{
	unqlite_col_record *pEntry;
	if( pCol->nRec < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	pEntry = pCol->apRecord[COL_RECORD_HASH(nId) & (pCol->nRecSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nId == nId ){
			/* Record found */
			return pEntry;
		}
		/* Point to the next entry */
		pEntry = pEntry->pNextCol;

	}
	/* No such record */
	return 0;
}